

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O0

void p2sc_init(char *prgname,char *appname,char *filename,char *runid)

{
  char *pcVar1;
  char *pcVar2;
  char *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  char *hist;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd8;
  
  if (in_RDI != 0) {
    pcVar1 = p2sc_get_string(in_stack_ffffffffffffffc8);
    if (pcVar1 == (char *)0x0) {
      p2sc_set_string(in_RCX,in_stack_ffffffffffffffd8);
    }
  }
  if (in_RSI != 0) {
    pcVar1 = p2sc_get_string(in_stack_ffffffffffffffc8);
    if (pcVar1 == (char *)0x0) {
      p2sc_set_string(in_RCX,in_stack_ffffffffffffffd8);
    }
  }
  if (in_RCX != (char *)0x0) {
    pcVar1 = p2sc_get_string(in_stack_ffffffffffffffc8);
    if (pcVar1 == (char *)0x0) {
      p2sc_set_string(in_RCX,in_stack_ffffffffffffffd8);
    }
  }
  if (in_RDX != 0) {
    p2sc_set_string(in_RCX,in_stack_ffffffffffffffd8);
  }
  pcVar1 = p2sc_get_string(in_stack_ffffffffffffffc8);
  pcVar2 = p2sc_get_string(in_stack_ffffffffffffffc8);
  pcVar1 = (char *)g_strdup_printf("%s %s",pcVar1,pcVar2);
  p2sc_set_string(in_RCX,pcVar1);
  g_free(pcVar1);
  return;
}

Assistant:

void p2sc_init(const char *prgname, const char *appname, const char *filename, const char *runid) {
    /* change of prg/appname/runid not allowed */
    if (prgname && !p2sc_get_string("prgname"))
        p2sc_set_string("prgname", prgname);
    if (appname && !p2sc_get_string("appname"))
        p2sc_set_string("appname", appname);
    if (runid && !p2sc_get_string("runid"))
        p2sc_set_string("runid", runid);
    /* allow change of filename, but avoid NULL */
    if (filename)
        p2sc_set_string("filename", filename);

    char *hist = g_strdup_printf("%s %s", p2sc_get_string("appname"), p2sc_get_string("runid"));
    p2sc_set_string("history", hist);
    g_free(hist);
}